

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O3

long __thiscall Wasm::WasmBinaryReader::LEB128<long,33u>(WasmBinaryReader *this,uint32 *length)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  
  *length = 0;
  pbVar3 = this->m_pc;
  iVar8 = 0x40;
  lVar5 = 0;
  bVar7 = 0;
  uVar9 = 0;
  do {
    uVar4 = (uint)lVar5;
    if (*(int *)&this->m_end - (int)pbVar3 == uVar4) {
      ThrowDecodingError(this,L"Out of file: Needed: %d, Left: %d",1,0);
    }
    pbVar1 = pbVar3 + lVar5;
    this->m_pc = pbVar1 + 1;
    bVar2 = *pbVar1;
    uVar9 = uVar9 | (ulong)(bVar2 & 0x7f) << (bVar7 & 0x3f);
    iVar8 = iVar8 + -7;
    lVar5 = lVar5 + 1;
  } while ((uVar4 < 4) && (bVar7 = bVar7 + 7, (char)bVar2 < '\0'));
  if ((-1 < (char)bVar2) &&
     ((((uint32)lVar5 != 5 || ((bVar2 & 0x70) == 0)) || ((bVar2 & 0x70) == 0x70)))) {
    *length = (uint32)lVar5;
    uVar6 = (long)(uVar9 << ((byte)iVar8 & 0x3f)) >> ((byte)iVar8 & 0x3f);
    if (iVar8 < 1) {
      uVar6 = uVar9;
    }
    return uVar6;
  }
  ThrowDecodingError(this,L"Invalid LEB128 format");
}

Assistant:

LEBType WasmBinaryReader::LEB128(uint32 &length)
{
    CompileAssert((sizeof(LEBType) * 8) >= bits);
    constexpr bool sign = LEBType(-1) < LEBType(0);
    LEBType result = 0;
    uint32 shift = 0;
    byte b = 0x80;
    length = 0;
    constexpr uint32 maxBytes = (uint32)((bits + 6) / 7);
    CompileAssert(maxBytes > 0);

    uint32 iByte = 0;
    for (; iByte < maxBytes && (b & 0x80) == 0x80; ++iByte)
    {
        CheckBytesLeft(1);
        b = *m_pc++;
        result = result | ((LEBType)(b & 0x7f) << shift);
        shift += 7;
    }

    if ((b & 0x80) == 0x80)
    {
        ThrowDecodingError(_u("Invalid LEB128 format"));
    }

    const bool isLastByte = iByte == maxBytes;
    constexpr bool hasExtraBits = (maxBytes * 7) != bits;
    if (hasExtraBits && isLastByte)
    {
        // A signed-LEB128 must sign-extend the final byte, excluding its most-significant bit
        // For unsigned values, the extra bits must be all zero.
        // For signed values, the extra bits *plus* the most significant bit must either be 0, or all ones.

        // e.g. for a 32-bit LEB128:
        //   bitsInLastByte = 4  (== 32 - (5-1) * 7)
        //     0bYYYXXXX where Y are extra bits and X are bits included in LEB128
        //   if signed: check if 0bYYYXXXX is 0b0000XXX or 0b1111XXX
        //   is unsigned: check if 0bYYYXXXX is 0b000XXXX

        constexpr int bitsInLastByte = bits - (maxBytes - 1) * 7;
        constexpr int lastBitToCheck = bitsInLastByte - (sign ? 1 : 0);
        constexpr byte signExtendedExtraBits = 0x7f & (0xFF << lastBitToCheck);
        const byte checkedBits = b & (0xFF << lastBitToCheck);
        bool validExtraBits =
            checkedBits == 0 ||
            (sign && checkedBits == signExtendedExtraBits);
        if (!validExtraBits)
        {
            ThrowDecodingError(_u("Invalid LEB128 format"));
        }
    }

    length = iByte;
    if (sign)
    {
        // Perform sign extension
        const int signExtendShift = (sizeof(LEBType) * 8) - shift;
        if (signExtendShift > 0)
        {
            result = static_cast<LEBType>(result << signExtendShift) >> signExtendShift;
        }
    }
    return result;
}